

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O3

Vector2 __thiscall pm::Sampler::sampleUnitDisk(Sampler *this,unsigned_long *count,int *jump)

{
  Vector2 VVar1;
  uint32_t uVar2;
  int *in_RCX;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar3 = *(ulong *)jump;
  uVar4 = uVar3 % (ulong)*(uint *)((long)count + 0xc);
  if (uVar4 == 0) {
    uVar2 = Random::integer((Random *)(count + 0xf),0,(uint32_t)count[2]);
    iVar5 = uVar2 * *(int *)((long)count + 0xc);
    *in_RCX = iVar5;
    uVar3 = *(ulong *)jump;
    uVar4 = uVar3 % (ulong)*(uint *)((long)count + 0xc);
  }
  else {
    iVar5 = *in_RCX;
  }
  *(ulong *)jump = uVar3 + 1;
  VVar1 = *(Vector2 *)
           (count[6] + (ulong)(uint)(*(int *)(uVar4 * 4 + count[0xc] + (long)iVar5 * 4) + iVar5) * 8
           );
  this->_vptr_Sampler = (_func_int **)VVar1;
  return VVar1;
}

Assistant:

Vector2 Sampler::sampleUnitDisk(unsigned long &count, int &jump)
{
	// Start of a new pixel
	if (count % numSamples_ == 0)
		jump = rnd_.integer(0, numSets_) * numSamples_;

	return diskSamples_[jump + shuffledIndices_[jump + count++ % numSamples_]];
}